

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_message.cpp
# Opt level: O2

void strings_equal<wchar_t>
               (string *n_c,string *n_s,string *n_p,int n,string *iexpected,locale *l,string domain)

{
  int iVar1;
  bool bVar2;
  __type _Var3;
  ostream *poVar4;
  basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *pbVar5;
  runtime_error *prVar6;
  string_type *psVar7;
  void *__buf;
  void *__buf_00;
  locale tmp_locale;
  allocator local_309;
  string_type tmp;
  undefined1 local_2e8 [32];
  _Alloc_hider local_2c8;
  size_type local_2c0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_2b8;
  _Alloc_hider local_2a8;
  size_type local_2a0;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_298;
  _Alloc_hider local_288;
  size_type local_280;
  anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
  local_278;
  string_type p;
  string_type s;
  string_type c;
  locale local_208;
  string_type expected;
  locale local_1e0;
  locale local_1d8;
  locale local_1d0;
  locale local_1c8;
  locale local_1c0;
  locale local_1b8;
  locale local_1b0;
  basic_ostringstream<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> ss;
  
  std::locale::locale(&local_208,l);
  to_correct_string<wchar_t>(&expected,iexpected,&local_208);
  std::locale::~locale(&local_208);
  std::__cxx11::string::string((string *)&ss,(n_c->_M_dataplus)._M_p,(allocator *)local_2e8);
  to<wchar_t>(&c,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,(n_s->_M_dataplus)._M_p,(allocator *)local_2e8);
  to<wchar_t>(&s,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  std::__cxx11::string::string((string *)&ss,(n_p->_M_dataplus)._M_p,(allocator *)local_2e8);
  to<wchar_t>(&p,(string *)&ss);
  std::__cxx11::string::~string((string *)&ss);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          domain._M_dataplus._M_p,"default");
  if (bVar2) {
    test_counter = test_counter + 1;
    booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&c,&s,&p,n)
    ;
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              ((string_type *)local_2e8,(basic_message<wchar_t> *)&ss,l);
    _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_2e8,&expected);
    std::__cxx11::wstring::~wstring((wstring *)local_2e8);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x4f);
      poVar4 = std::operator<<(poVar4," bl::translate(c,s,p,n).str(l)==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_2e8);
        booster::runtime_error::runtime_error(prVar6,(string *)&ss);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    test_counter = test_counter + 1;
    _ss = n;
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              ((string_type *)local_2e8,(basic_message<wchar_t> *)&ss,l);
    _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_2e8,&expected);
    std::__cxx11::wstring::~wstring((wstring *)local_2e8);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x51);
      poVar4 = std::operator<<(poVar4," bl::translate(c_c_str,s_c_str,p_c_str,n).str(l)==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_2e8);
        booster::runtime_error::runtime_error(prVar6,(string *)&ss);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::locale::locale(&tmp_locale);
    std::locale::global(&local_1b0);
    std::locale::~locale(&local_1b0);
    booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&c,&s,&p,n)
    ;
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_(&tmp,(basic_message<wchar_t> *)&ss);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
    test_counter = test_counter + 1;
    _Var3 = std::operator==(&tmp,&expected);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x55);
      poVar4 = std::operator<<(poVar4," tmp==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_2e8);
        booster::runtime_error::runtime_error(prVar6,(string *)&ss);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&c,&s,&p,n)
    ;
    booster::locale::basic_message<wchar_t>::str_abi_cxx11_
              ((string_type *)local_2e8,(basic_message<wchar_t> *)&ss);
    std::__cxx11::wstring::operator=((wstring *)&tmp,(wstring *)local_2e8);
    std::__cxx11::wstring::~wstring((wstring *)local_2e8);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
    test_counter = test_counter + 1;
    _Var3 = std::operator==(&tmp,&expected);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x57);
      poVar4 = std::operator<<(poVar4," tmp==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_2e8);
        booster::runtime_error::runtime_error(prVar6,(string *)&ss);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::locale::global(&local_1b8);
    std::locale::~locale(&local_1b8);
    std::__cxx11::wostringstream::wostringstream((wostringstream *)&ss);
    std::wios::imbue(&local_1c0);
    std::locale::~locale(&local_1c0);
    psVar7 = &p;
    booster::locale::basic_message<wchar_t>::basic_message
              ((basic_message<wchar_t> *)local_2e8,&c,&s,psVar7,n);
    booster::locale::basic_message<wchar_t>::write
              ((basic_message<wchar_t> *)local_2e8,(int)&ss,__buf,(size_t)psVar7);
    booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)local_2e8);
    test_counter = test_counter + 1;
    std::__cxx11::wstringbuf::str();
    _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                             *)local_2e8,&expected);
    std::__cxx11::wstring::~wstring((wstring *)local_2e8);
    if (!_Var3) {
      poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
      poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5d);
      poVar4 = std::operator<<(poVar4," ss.str()==expected");
      std::endl<char,std::char_traits<char>>(poVar4);
      iVar1 = error_counter + 1;
      bVar2 = 0x14 < error_counter;
      error_counter = iVar1;
      if (bVar2) {
        prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
        std::__cxx11::string::string
                  ((string *)local_2e8,"Error limits reached, stopping unit test",&local_309);
        booster::runtime_error::runtime_error(prVar6,(string *)local_2e8);
        __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    std::__cxx11::wostringstream::~wostringstream((wostringstream *)&ss);
    std::__cxx11::wstring::~wstring((wstring *)&tmp);
    std::locale::~locale(&tmp_locale);
  }
  test_counter = test_counter + 1;
  booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&c,&s,&p,n);
  booster::locale::basic_message<wchar_t>::str
            ((string_type *)local_2e8,(basic_message<wchar_t> *)&ss,l,
             (string *)domain._M_dataplus._M_p);
  _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_2e8,&expected);
  std::__cxx11::wstring::~wstring((wstring *)local_2e8);
  booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x5f);
    poVar4 = std::operator<<(poVar4," bl::translate(c,s,p,n).str(l,domain)==expected");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_2e8);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::locale(&tmp_locale);
  std::locale::global(&local_1c8);
  std::locale::~locale(&local_1c8);
  test_counter = test_counter + 1;
  booster::locale::basic_message<wchar_t>::basic_message((basic_message<wchar_t> *)&ss,&c,&s,&p,n);
  booster::locale::basic_message<wchar_t>::str
            ((string_type *)local_2e8,(basic_message<wchar_t> *)&ss,
             (string *)domain._M_dataplus._M_p);
  _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_2e8,&expected);
  std::__cxx11::wstring::~wstring((wstring *)local_2e8);
  booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)&ss);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x62);
    poVar4 = std::operator<<(poVar4," bl::translate(c,s,p,n).str(domain)==expected");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)&ss,"Error limits reached, stopping unit test",(allocator *)local_2e8);
      booster::runtime_error::runtime_error(prVar6,(string *)&ss);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::locale::global(&local_1d0);
  std::locale::~locale(&local_1d0);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&ss);
  std::wios::imbue(&local_1d8);
  std::locale::~locale(&local_1d8);
  std::__cxx11::string::string((string *)&tmp,(string *)domain._M_dataplus._M_p);
  pbVar5 = booster::locale::as::details::operator<<
                     ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&ss,(set_domain *)&tmp);
  psVar7 = &p;
  booster::locale::basic_message<wchar_t>::basic_message
            ((basic_message<wchar_t> *)local_2e8,&c,&s,psVar7,n);
  booster::locale::basic_message<wchar_t>::write
            ((basic_message<wchar_t> *)local_2e8,(int)pbVar5,__buf_00,(size_t)psVar7);
  booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)local_2e8);
  std::__cxx11::string::~string((string *)&tmp);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_2e8,&expected);
  std::__cxx11::wstring::~wstring((wstring *)local_2e8);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x68);
    poVar4 = std::operator<<(poVar4," ss.str()==expected");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_2e8,"Error limits reached, stopping unit test",(allocator *)&tmp);
      booster::runtime_error::runtime_error(prVar6,(string *)local_2e8);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&ss);
  std::__cxx11::wostringstream::wostringstream((wostringstream *)&ss);
  std::wios::imbue(&local_1e0);
  std::locale::~locale(&local_1e0);
  std::__cxx11::string::string((string *)&tmp,(string *)domain._M_dataplus._M_p);
  pbVar5 = booster::locale::as::details::operator<<
                     ((basic_ostream<wchar_t,_std::char_traits<wchar_t>_> *)&ss,(set_domain *)&tmp);
  local_2c8._M_p = (pointer)&local_2b8;
  local_2e8._8_8_ = s._M_dataplus._M_p;
  local_2e8._16_8_ = c._M_dataplus._M_p;
  local_2e8._24_8_ = p._M_dataplus._M_p;
  local_2c0 = 0;
  local_2b8._M_local_buf[0] = L'\0';
  local_2a8._M_p = (pointer)&local_298;
  local_2a0 = 0;
  local_298._M_local_buf[0] = L'\0';
  local_288._M_p = (pointer)&local_278;
  local_280 = 0;
  local_278._M_local_buf[0] = L'\0';
  local_2e8._0_4_ = n;
  booster::locale::basic_message<wchar_t>::write
            ((basic_message<wchar_t> *)local_2e8,(int)pbVar5,s._M_dataplus._M_p,
             (size_t)local_288._M_p);
  booster::locale::basic_message<wchar_t>::~basic_message((basic_message<wchar_t> *)local_2e8);
  std::__cxx11::string::~string((string *)&tmp);
  test_counter = test_counter + 1;
  std::__cxx11::wstringbuf::str();
  _Var3 = std::operator==((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                           *)local_2e8,&expected);
  std::__cxx11::wstring::~wstring((wstring *)local_2e8);
  if (!_Var3) {
    poVar4 = std::operator<<((ostream *)&std::cerr,"Error in line:");
    poVar4 = (ostream *)std::ostream::operator<<((ostream *)poVar4,0x6e);
    poVar4 = std::operator<<(poVar4," ss.str()==expected");
    std::endl<char,std::char_traits<char>>(poVar4);
    iVar1 = error_counter + 1;
    bVar2 = 0x14 < error_counter;
    error_counter = iVar1;
    if (bVar2) {
      prVar6 = (runtime_error *)__cxa_allocate_exception(0x30);
      std::__cxx11::string::string
                ((string *)local_2e8,"Error limits reached, stopping unit test",(allocator *)&tmp);
      booster::runtime_error::runtime_error(prVar6,(string *)local_2e8);
      __cxa_throw(prVar6,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error);
    }
  }
  std::__cxx11::wostringstream::~wostringstream((wostringstream *)&ss);
  std::locale::~locale(&tmp_locale);
  std::__cxx11::wstring::~wstring((wstring *)&p);
  std::__cxx11::wstring::~wstring((wstring *)&s);
  std::__cxx11::wstring::~wstring((wstring *)&c);
  std::__cxx11::wstring::~wstring((wstring *)&expected);
  return;
}

Assistant:

void strings_equal(std::string n_c,std::string n_s,std::string n_p,int n,std::string iexpected,std::locale const &l,std::string domain)
{
    typedef std::basic_string<Char> string_type;
    string_type expected=to_correct_string<Char>(iexpected,l);

    string_type c = to<Char>(n_c.c_str());
    string_type s = to<Char>(n_s.c_str());
    string_type p = to<Char>(n_p.c_str());

    if(domain=="default") {
        TEST(bl::translate(c,s,p,n).str(l)==expected);
        Char const *c_c_str = c.c_str(),*s_c_str=s.c_str(), *p_c_str=p.c_str(); // workaround gcc-3.4 bug
        TEST(bl::translate(c_c_str,s_c_str,p_c_str,n).str(l)==expected);
        std::locale tmp_locale=std::locale();
        std::locale::global(l);
        string_type tmp=bl::translate(c,s,p,n);
        TEST(tmp==expected);
        tmp=bl::translate(c,s,p,n).str();
        TEST(tmp==expected);
        std::locale::global(tmp_locale);

        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::translate(c,s,p,n);
        TEST(ss.str()==expected);
    }
    TEST( bl::translate(c,s,p,n).str(l,domain)==expected );
    std::locale tmp_locale=std::locale();
    std::locale::global(l);
    TEST(bl::translate(c,s,p,n).str(domain)==expected);
    std::locale::global(tmp_locale);
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(c,s,p,n);
        TEST(ss.str()==expected);
    }
    {
        std::basic_ostringstream<Char> ss;
        ss.imbue(l);
        ss << bl::as::domain(domain) << bl::translate(c.c_str(),s.c_str(),p.c_str(),n);
        TEST(ss.str()==expected);
    }
}